

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmTarget *target,string *lang,string *config)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  cmTarget *pcVar2;
  bool bVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  pointer pbVar11;
  undefined1 auVar12 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  features;
  string langFlagRegexVar;
  RegularExpression r;
  string local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string *local_1e0;
  cmTarget *local_1d8;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [72];
  char *local_f0;
  
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_1e0 = flags;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"CMAKE_","");
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_218,(ulong)(lang->_M_dataplus)._M_p);
  local_1a8 = (undefined1  [8])local_198;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar9) {
    local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_198[0]._8_8_ = plVar4[3];
  }
  else {
    local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_1a8 = (undefined1  [8])*plVar4;
  }
  paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar4[1];
  *plVar4 = (long)paVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_1a8);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  psVar10 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1d0.field_2._M_allocated_capacity = *psVar10;
    local_1d0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_1d0.field_2._M_allocated_capacity = *psVar10;
    local_1d0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmMakefile::GetDefinition(this->Makefile,&local_1d0);
  local_1d8 = target;
  if (pcVar5 == (char *)0x0) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"COMPILE_FLAGS","");
    pcVar5 = cmTarget::GetProperty(target,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar5 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[6])(this,local_1e0,pcVar5);
    }
    local_1a8 = (undefined1  [8])0x0;
    paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_198[0]._M_allocated_capacity = 0;
    cmTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1a8,config,lang);
    for (auVar12 = local_1a8; auVar12 != (undefined1  [8])paStack_1a0;
        auVar12 = (undefined1  [8])((long)auVar12 + 0x20)) {
      (*this->_vptr_cmLocalGenerator[7])(this,local_1e0,auVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
  }
  else {
    local_f0 = (char *)0x0;
    cmsys::RegularExpression::compile((RegularExpression *)local_1a8,pcVar5);
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"COMPILE_FLAGS","");
    pcVar5 = cmTarget::GetProperty(target,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine(pcVar5,&local_1f8);
    }
    cmTarget::GetCompileOptions(target,&local_1f8,config,lang);
    if (local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar11 = local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar3 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_1a8,(pbVar11->_M_dataplus)._M_p);
        if (bVar3) {
          (*this->_vptr_cmLocalGenerator[7])(this,local_1e0,pbVar11);
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               local_1f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f8);
    target = local_1d8;
    if (local_f0 != (char *)0x0) {
      operator_delete__(local_f0);
      target = local_1d8;
    }
  }
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmTarget::GetCompileFeatures(target,&local_1f8,config);
  for (pbVar11 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar11 !=
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
    bVar3 = cmMakefile::AddRequiredTargetFeature(this->Makefile,target,pbVar11,(string *)0x0);
    if (!bVar3) goto LAB_002c2267;
  }
  p_Var7 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  local_1b0 = lang;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      std::__cxx11::string::append((char *)local_1a8);
      pcVar5 = cmTarget::GetProperty(target,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if (pcVar5 != (char *)0x0) {
        this_00 = this->Makefile;
        local_1a8 = (undefined1  [8])local_198;
        sVar6 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar5,pcVar5 + sVar6);
        bVar3 = cmMakefile::IsLaterStandard
                          (this_00,(string *)(p_Var7 + 1),(string *)local_1a8,(string *)(p_Var7 + 2)
                          );
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        pcVar2 = local_1d8;
        target = local_1d8;
        if (bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"The COMPILE_FEATURES property of target \"",0x29);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pcVar2->Name)._M_dataplus._M_p,
                              (pcVar2->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" was evaluated when computing the link implementation, and the \"",
                     0x41);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_STANDARD\" was \"",0x10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var7 + 2),(long)p_Var7[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                     ,0x6f);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_STANDARD\" \"",0xc);
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                     ,0x75);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          IssueMessage(this,FATAL_ERROR,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          goto LAB_002c2267;
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  AddCompilerRequirementFlag(this,local_1e0,target,local_1b0);
LAB_002c2267:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCompileOptions(
  std::string& flags, cmTarget* target,
  const std::string& lang, const std::string& config
  )
{
  std::string langFlagRegexVar = std::string("CMAKE_")+lang+"_FLAG_REGEX";
  if(const char* langFlagRegexStr =
     this->Makefile->GetDefinition(langFlagRegexVar))
    {
    // Filter flags acceptable to this language.
    cmsys::RegularExpression r(langFlagRegexStr);
    std::vector<std::string> opts;
    if(const char* targetFlags = target->GetProperty("COMPILE_FLAGS"))
      {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
      }
    target->GetCompileOptions(opts, config, lang);
    for(std::vector<std::string>::const_iterator i = opts.begin();
        i != opts.end(); ++i)
      {
      if(r.find(i->c_str()))
        {
        // (Re-)Escape this flag.  COMPILE_FLAGS were already parsed
        // as a command line above, and COMPILE_OPTIONS are escaped.
        this->AppendFlagEscape(flags, *i);
        }
      }
    }
  else
    {
    // Use all flags.
    if(const char* targetFlags = target->GetProperty("COMPILE_FLAGS"))
      {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
      }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    for(std::vector<std::string>::const_iterator i = opts.begin();
        i != opts.end(); ++i)
      {
      // COMPILE_OPTIONS are escaped.
      this->AppendFlagEscape(flags, *i);
      }
    }
  std::vector<std::string> features;
  target->GetCompileFeatures(features, config);
  for(std::vector<std::string>::const_iterator it = features.begin();
      it != features.end(); ++it)
    {
     if (!this->Makefile->AddRequiredTargetFeature(target, *it))
      {
      return;
      }
    }

  for(std::map<std::string, std::string>::const_iterator it
      = target->GetMaxLanguageStandards().begin();
      it != target->GetMaxLanguageStandards().end(); ++it)
    {
    const char* standard = target->GetProperty(it->first + "_STANDARD");
    if(!standard)
      {
      continue;
      }
    if (this->Makefile->IsLaterStandard(it->first, standard, it->second))
      {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \""
        << target->GetName() << "\" was evaluated when computing the link "
        "implementation, and the \"" << it->first << "_STANDARD\" was \""
        << it->second << "\" for that computation.  Computing the "
        "COMPILE_FEATURES based on the link implementation resulted in a "
        "higher \"" << it->first << "_STANDARD\" \"" << standard << "\".  "
        "This is not permitted. The COMPILE_FEATURES may not both depend on "
        "and be depended on by the link implementation." << std::endl;
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    }
  this->AddCompilerRequirementFlag(flags, target, lang);
}